

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void capnp::_::anon_unknown_0::verifyClient(Client *client,int *callCount,WaitScope *waitScope)

{
  int iVar1;
  bool bVar2;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_e8;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Maybe<capnp::MessageSize> local_38;
  
  iVar1 = *callCount;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest(&request,client,&local_38);
  *(undefined4 *)request.super_Builder._builder.data = 0x7b;
  *(byte *)((long)request.super_Builder._builder.data + 4) =
       *(byte *)((long)request.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_e8,(int)&request,__buf,in_RCX,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response,&local_e8);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_e8);
  local_e8.super_Builder._builder._0_16_ =
       capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX(&response.super_Reader);
  bVar2 = kj::operator==("foo",(StringPtr *)&local_e8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    local_e8.super_Builder._builder._0_16_ =
         capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                   (&response.super_Reader);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ab,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (char (*) [4])0x4f93d8,(Reader *)&local_e8);
  }
  if ((iVar1 + 1 != *callCount) && (kj::_::Debug::minSeverity < 3)) {
    local_e8.super_Builder._builder.segment._0_4_ = iVar1 + 1;
    kj::_::Debug::log<char_const(&)[48],int,int_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ac,ERROR,
               "\"failed: expected \" \"(origCount + 1) == (callCount)\", origCount + 1, callCount",
               (char (*) [48])"failed: expected (origCount + 1) == (callCount)",(int *)&local_e8,
               callCount);
  }
  kj::Own<capnp::ResponseHook>::dispose(&response.hook);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  return;
}

Assistant:

void verifyClient(test::TestInterface::Client client, const int& callCount,
                  kj::WaitScope& waitScope) {
  int origCount = callCount;
  auto request = client.fooRequest();
  request.setI(123);
  request.setJ(true);
  auto response = request.send().wait(waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(origCount + 1, callCount);
}